

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O2

void Vec_StrPutS(Vec_Str_t *vOut,char *pStr)

{
  for (; *pStr != '\0'; pStr = pStr + 1) {
    Vec_StrPush(vOut,*pStr);
  }
  Vec_StrPush(vOut,'\0');
  return;
}

Assistant:

static inline void Vec_StrPutS( Vec_Str_t * vOut, char * pStr )
{
    while ( *pStr )
        Vec_StrPush( vOut, *pStr++ );
    Vec_StrPush( vOut, (char)0 );
}